

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

padding_info spdlog::pattern_formatter::handle_padspec_(const_iterator *it,const_iterator end)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  byte *pbVar4;
  unsigned_long *puVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool truncate;
  size_t digit;
  size_t width;
  pad_side side;
  size_t max_width;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_41;
  unsigned_long local_38;
  pad_side local_2c;
  unsigned_long local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  padding_info local_10;
  
  local_28 = 0x40;
  local_20 = in_RDI;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    memset(&local_10,0,0x10);
    details::padding_info::padding_info(&local_10);
  }
  else {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_20);
    if (*pcVar3 == '-') {
      local_2c = right;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_20);
    }
    else if (*pcVar3 == '=') {
      local_2c = center;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_20);
    }
    else {
      local_2c = left;
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (!bVar1) {
      pbVar4 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(local_20);
      iVar2 = isdigit((uint)*pbVar4);
      if (iVar2 != 0) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_20);
        local_38 = (long)*pcVar3 - 0x30;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_20);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8);
          in_stack_ffffffffffffffb7 = false;
          if (bVar1) {
            pbVar4 = (byte *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(local_20);
            iVar2 = isdigit((uint)*pbVar4);
            in_stack_ffffffffffffffb7 = iVar2 != 0;
          }
          if ((bool)in_stack_ffffffffffffffb7 == false) break;
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(local_20);
          local_38 = local_38 * 10 + (long)*pcVar3 + -0x30;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(local_20);
        }
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        if ((bVar1) &&
           (pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(local_20), *pcVar3 == '!')) {
          local_41 = true;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(local_20);
        }
        else {
          local_41 = false;
        }
        puVar5 = std::min<unsigned_long>(&local_38,&local_28);
        details::padding_info::padding_info(&local_10,*puVar5,local_2c,local_41);
        return local_10;
      }
    }
    memset(&local_10,0,0x10);
    details::padding_info::padding_info(&local_10);
  }
  return local_10;
}

Assistant:

SPDLOG_INLINE details::padding_info pattern_formatter::handle_padspec_(std::string::const_iterator &it, std::string::const_iterator end)
{
    using details::padding_info;
    using details::scoped_padder;
    const size_t max_width = 64;
    if (it == end)
    {
        return padding_info{};
    }

    padding_info::pad_side side;
    switch (*it)
    {
    case '-':
        side = padding_info::right;
        ++it;
        break;
    case '=':
        side = padding_info::center;
        ++it;
        break;
    default:
        side = details::padding_info::left;
        break;
    }

    if (it == end || !std::isdigit(static_cast<unsigned char>(*it)))
    {
        return padding_info{}; // no padding if no digit found here
    }

    auto width = static_cast<size_t>(*it) - '0';
    for (++it; it != end && std::isdigit(static_cast<unsigned char>(*it)); ++it)
    {
        auto digit = static_cast<size_t>(*it) - '0';
        width = width * 10 + digit;
    }

    // search for the optional truncate marker '!'
    bool truncate;
    if (it != end && *it == '!')
    {
        truncate = true;
        ++it;
    }
    else
    {
        truncate = false;
    }

    return details::padding_info{std::min<size_t>(width, max_width), side, truncate};
}